

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O0

int Rnm_ManSensitize(Rnm_Man_t *p)

{
  Rnm_Obj_t RVar1;
  Rnm_Obj_t RVar2;
  Gia_Man_t *pGVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Rnm_Obj_t *pRVar7;
  Gia_Obj_t *pGVar8;
  Rnm_Obj_t *pRVar9;
  Rnm_Obj_t *pRVar10;
  bool bVar11;
  int local_3c;
  int local_38;
  int iBit;
  int i;
  int f;
  Gia_Obj_t *pObj;
  Rnm_Obj_t *pRnm1;
  Rnm_Obj_t *pRnm0;
  Rnm_Obj_t *pRnm;
  Rnm_Man_t *p_local;
  
  local_3c = p->pCex->nRegs;
  iBit = 0;
  do {
    if (p->pCex->iFrame < iBit) {
      if (local_3c != p->pCex->nBits) {
        __assert_fail("iBit == p->pCex->nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                      ,0x1c3,"int Rnm_ManSensitize(Rnm_Man_t *)");
      }
      pGVar8 = Gia_ManPo(p->pGia,0);
      pRVar7 = Rnm_ManObj(p,pGVar8,p->pCex->iFrame);
      if (((uint)*pRVar7 & 1) != 1) {
        printf("Output value is incorrect.\n");
      }
      return (uint)*pRVar7 >> 4 & 0xffffff;
    }
    local_38 = 0;
    while( true ) {
      iVar4 = Vec_IntSize(p->vMap);
      bVar11 = false;
      if (local_38 < iVar4) {
        pGVar3 = p->pGia;
        iVar4 = Vec_IntEntry(p->vMap,local_38);
        _i = Gia_ManObj(pGVar3,iVar4);
        bVar11 = _i != (Gia_Obj_t *)0x0;
      }
      if (!bVar11) break;
      iVar4 = Gia_ObjIsCi(_i);
      if ((iVar4 == 0) && (iVar4 = Gia_ObjIsAnd(_i), iVar4 == 0)) {
        __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                      ,0x196,"int Rnm_ManSensitize(Rnm_Man_t *)");
      }
      pRVar7 = Rnm_ManObj(p,_i,iBit);
      uVar5 = Abc_InfoHasBit((uint *)(p->pCex + 1),local_3c + local_38);
      *pRVar7 = (Rnm_Obj_t)((uint)*pRVar7 & 0xfffffffe | uVar5 & 1);
      iVar4 = Gia_ObjIsPi(p->pGia,_i);
      if (iVar4 == 0) {
        if (_i->Value == 0) {
          __assert_fail("pObj->Value > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                        ,0x19b,"int Rnm_ManSensitize(Rnm_Man_t *)");
        }
        *pRVar7 = (Rnm_Obj_t)((uint)*pRVar7 & 0xf000000f | (_i->Value & 0xffffff) << 4);
        *pRVar7 = (Rnm_Obj_t)((uint)*pRVar7 & 0xfffffff7 | 8);
      }
      local_38 = local_38 + 1;
    }
    local_38 = 0;
    while( true ) {
      iVar4 = Vec_IntSize(p->vObjs);
      bVar11 = false;
      if (local_38 < iVar4) {
        pGVar3 = p->pGia;
        iVar4 = Vec_IntEntry(p->vObjs,local_38);
        _i = Gia_ManObj(pGVar3,iVar4);
        bVar11 = _i != (Gia_Obj_t *)0x0;
      }
      if (!bVar11) break;
      iVar4 = Gia_ObjIsRo(p->pGia,_i);
      if (((iVar4 == 0) && (iVar4 = Gia_ObjIsAnd(_i), iVar4 == 0)) &&
         (iVar4 = Gia_ObjIsCo(_i), iVar4 == 0)) {
        __assert_fail("Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                      ,0x1a2,"int Rnm_ManSensitize(Rnm_Man_t *)");
      }
      pRVar7 = Rnm_ManObj(p,_i,iBit);
      if (((uint)*pRVar7 >> 3 & 1) != 0) {
        __assert_fail("!pRnm->fPPi",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                      ,0x1a4,"int Rnm_ManSensitize(Rnm_Man_t *)");
      }
      iVar4 = Gia_ObjIsRo(p->pGia,_i);
      if (iVar4 == 0) {
        iVar4 = Gia_ObjIsCo(_i);
        if (iVar4 == 0) {
          iVar4 = Gia_ObjIsAnd(_i);
          if (iVar4 == 0) {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                          ,0x1b5,"int Rnm_ManSensitize(Rnm_Man_t *)");
          }
          pGVar8 = Gia_ObjFanin0(_i);
          pRVar9 = Rnm_ManObj(p,pGVar8,iBit);
          pGVar8 = Gia_ObjFanin1(_i);
          pRVar10 = Rnm_ManObj(p,pGVar8,iBit);
          RVar1 = *pRVar9;
          uVar5 = Gia_ObjFaninC0(_i);
          RVar2 = *pRVar10;
          uVar6 = Gia_ObjFaninC1(_i);
          *pRVar7 = (Rnm_Obj_t)
                    ((uint)*pRVar7 & 0xfffffffe |
                    ((uint)RVar1 & 1 ^ uVar5) & ((uint)RVar2 & 1 ^ uVar6) & 1);
          if (((uint)*pRVar7 & 1) == 1) {
            uVar5 = Abc_MaxInt((uint)*pRVar9 >> 4 & 0xffffff,(uint)*pRVar10 >> 4 & 0xffffff);
            *pRVar7 = (Rnm_Obj_t)((uint)*pRVar7 & 0xf000000f | (uVar5 & 0xffffff) << 4);
          }
          else {
            RVar1 = *pRVar9;
            uVar5 = Gia_ObjFaninC0(_i);
            if ((((uint)RVar1 & 1) == uVar5) &&
               (RVar1 = *pRVar10, uVar5 = Gia_ObjFaninC1(_i), ((uint)RVar1 & 1) == uVar5)) {
              uVar5 = Abc_MinInt((uint)*pRVar9 >> 4 & 0xffffff,(uint)*pRVar10 >> 4 & 0xffffff);
              *pRVar7 = (Rnm_Obj_t)((uint)*pRVar7 & 0xf000000f | (uVar5 & 0xffffff) << 4);
            }
            else {
              RVar1 = *pRVar9;
              uVar5 = Gia_ObjFaninC0(_i);
              if (((uint)RVar1 & 1) == uVar5) {
                *pRVar7 = (Rnm_Obj_t)
                          ((uint)*pRVar7 & 0xf000000f | ((uint)*pRVar9 >> 4 & 0xffffff) << 4);
              }
              else {
                *pRVar7 = (Rnm_Obj_t)
                          ((uint)*pRVar7 & 0xf000000f | ((uint)*pRVar10 >> 4 & 0xffffff) << 4);
              }
            }
          }
        }
        else {
          pGVar8 = Gia_ObjFanin0(_i);
          pRVar9 = Rnm_ManObj(p,pGVar8,iBit);
          RVar1 = *pRVar9;
          uVar5 = Gia_ObjFaninC0(_i);
          *pRVar7 = (Rnm_Obj_t)((uint)*pRVar7 & 0xfffffffe | ((uint)RVar1 & 1 ^ uVar5) & 1);
          *pRVar7 = (Rnm_Obj_t)((uint)*pRVar7 & 0xf000000f | ((uint)*pRVar9 >> 4 & 0xffffff) << 4);
        }
      }
      else if (iBit != 0) {
        pGVar8 = Gia_ObjRoToRi(p->pGia,_i);
        pRVar9 = Rnm_ManObj(p,pGVar8,iBit + -1);
        *pRVar7 = (Rnm_Obj_t)((uint)*pRVar7 & 0xfffffffe | (uint)*pRVar9 & 1);
        *pRVar7 = (Rnm_Obj_t)((uint)*pRVar7 & 0xf000000f | ((uint)*pRVar9 >> 4 & 0xffffff) << 4);
      }
      local_38 = local_38 + 1;
    }
    iBit = iBit + 1;
    local_3c = p->pCex->nPis + local_3c;
  } while( true );
}

Assistant:

int Rnm_ManSensitize( Rnm_Man_t * p )
{
    Rnm_Obj_t * pRnm, * pRnm0, * pRnm1;
    Gia_Obj_t * pObj;
    int f, i, iBit = p->pCex->nRegs;
    // const0 is initialized automatically in all timeframes
    for ( f = 0; f <= p->pCex->iFrame; f++, iBit += p->pCex->nPis )
    {
        Gia_ManForEachObjVec( p->vMap, p->pGia, pObj, i )
        {
            assert( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) );
            pRnm = Rnm_ManObj( p, pObj, f );
            pRnm->Value = Abc_InfoHasBit( p->pCex->pData, iBit + i );
            if ( !Gia_ObjIsPi(p->pGia, pObj) ) // this is PPI
            {
                assert( pObj->Value > 0 );
                pRnm->Prio = pObj->Value;
                pRnm->fPPi = 1;
            }
        }
        Gia_ManForEachObjVec( p->vObjs, p->pGia, pObj, i )
        {
            assert( Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) );
            pRnm = Rnm_ManObj( p, pObj, f );
            assert( !pRnm->fPPi );
            if ( Gia_ObjIsRo(p->pGia, pObj) )
            {
                if ( f == 0 )
                    continue;
                pRnm0 = Rnm_ManObj( p, Gia_ObjRoToRi(p->pGia, pObj), f-1 );
                pRnm->Value = pRnm0->Value;
                pRnm->Prio  = pRnm0->Prio;
                continue;
            }
            if ( Gia_ObjIsCo(pObj) )
            {
                pRnm0 = Rnm_ManObj( p, Gia_ObjFanin0(pObj), f );
                pRnm->Value = (pRnm0->Value ^ Gia_ObjFaninC0(pObj));
                pRnm->Prio  = pRnm0->Prio;
                continue;
            }
            assert( Gia_ObjIsAnd(pObj) );
            pRnm0 = Rnm_ManObj( p, Gia_ObjFanin0(pObj), f );
            pRnm1 = Rnm_ManObj( p, Gia_ObjFanin1(pObj), f );
            pRnm->Value = (pRnm0->Value ^ Gia_ObjFaninC0(pObj)) & (pRnm1->Value ^ Gia_ObjFaninC1(pObj));
            if ( pRnm->Value == 1 )
                pRnm->Prio  = Abc_MaxInt( pRnm0->Prio, pRnm1->Prio );
            else if ( (pRnm0->Value ^ Gia_ObjFaninC0(pObj)) == 0 && (pRnm1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
                pRnm->Prio  = Abc_MinInt( pRnm0->Prio, pRnm1->Prio ); // choice
            else if ( (pRnm0->Value ^ Gia_ObjFaninC0(pObj)) == 0 )
                pRnm->Prio  = pRnm0->Prio;
            else 
                pRnm->Prio  = pRnm1->Prio;
        }
    }
    assert( iBit == p->pCex->nBits );
    pRnm = Rnm_ManObj( p, Gia_ManPo(p->pGia, 0), p->pCex->iFrame );
    if ( pRnm->Value != 1 )
        printf( "Output value is incorrect.\n" );
    return pRnm->Prio;
}